

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_operations.hpp
# Opt level: O0

rt_expression_interface<double> *
viennamath::diff_impl<viennamath::rt_expression_interface<double>,double>
          (rt_expression_interface<double> *e,FunctionSymbolType *param_2)

{
  int iVar1;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *prVar2;
  undefined4 extraout_var;
  ulong uVar3;
  undefined4 extraout_var_00;
  op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_> *this;
  expression_not_differentiable_exception *this_00;
  rt_expression_interface<double> *local_88;
  allocator<char> local_71;
  string local_70;
  long *local_50;
  rt_expression_interface<double> *new_expr;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *local_38;
  rt_expression_interface<double> *c0;
  FunctionSymbolType *ptr;
  rt_expression_interface<double> *diff_var_local;
  rt_expression_interface<double> *e_local;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *local_10;
  
  ptr = param_2;
  diff_var_local = e;
  if (param_2 == (FunctionSymbolType *)0x0) {
    local_88 = (rt_expression_interface<double> *)0x0;
  }
  else {
    local_88 = (rt_expression_interface<double> *)
               __dynamic_cast(param_2,&rt_expression_interface<double>::typeinfo,
                              &rt_function_symbol<viennamath::rt_expression_interface<double>>::
                               typeinfo,0);
  }
  c0 = local_88;
  if (local_88 != (rt_expression_interface<double> *)0x0) {
    prVar2 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x10);
    rt_constant<double,_viennamath::rt_expression_interface<double>_>::rt_constant
              ((rt_constant<double,_viennamath::rt_expression_interface<double>_> *)prVar2,0.0);
    local_38 = prVar2;
    iVar1 = (*diff_var_local->_vptr_rt_expression_interface[0x12])(diff_var_local,ptr);
    local_50 = (long *)CONCAT44(extraout_var,iVar1);
    uVar3 = (**(code **)(*local_50 + 0x58))(local_50,local_38);
    if ((uVar3 & 1) == 0) {
      if (local_38 != (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)0x0) {
        (*(local_38->super_rt_expression_interface<double>)._vptr_rt_expression_interface[1])();
      }
      prVar2 = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
      iVar1 = (*diff_var_local->_vptr_rt_expression_interface[0x12])(diff_var_local,ptr);
      this = (op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>
              *)operator_new(0x10);
      op_unary<viennamath::op_gradient<double>,_viennamath::rt_expression_interface<double>_>::
      op_unary(this);
      rt_unary_expr<viennamath::rt_expression_interface<double>_>::rt_unary_expr
                (prVar2,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar1),
                 (op_interface_type *)this);
      local_10 = prVar2;
    }
    else {
      if (local_50 != (long *)0x0) {
        (**(code **)(*local_50 + 8))();
      }
      local_10 = local_38;
    }
    return &local_10->super_rt_expression_interface<double>;
  }
  this_00 = (expression_not_differentiable_exception *)__cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Cannot differentiate gradient operator!",&local_71);
  expression_not_differentiable_exception::expression_not_differentiable_exception
            (this_00,&local_70);
  __cxa_throw(this_00,&expression_not_differentiable_exception::typeinfo,
              expression_not_differentiable_exception::~expression_not_differentiable_exception);
}

Assistant:

InterfaceType * diff_impl(const InterfaceType * e, op_gradient<NumericT>, const InterfaceType * diff_var)
  {
    typedef rt_function_symbol<InterfaceType>  FunctionSymbolType;
    const FunctionSymbolType * ptr = dynamic_cast< const FunctionSymbolType *>(diff_var);
    if (ptr != NULL)
    {
      InterfaceType * c0 = new rt_constant<NumericT, InterfaceType>(0);
      InterfaceType * new_expr = e->diff(diff_var);

      if (new_expr->deep_equal(c0)) // grad(0) is directly compressed to 0
      {
        delete new_expr;
        return c0;
      }

      // return grad(...)
      delete c0;
      return new rt_unary_expr<InterfaceType>(e->diff(diff_var), new op_unary<op_gradient<NumericT>, InterfaceType>());
    }

    throw expression_not_differentiable_exception("Cannot differentiate gradient operator!");
    return NULL;
  }